

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O3

Hop_Obj_t * Abc_NtkMfsInterplate(Mfs_Man_t *p,int *pCands,int nCands)

{
  Vec_Int_t *pVVar1;
  Cnf_Dat_t *pCVar2;
  int iVar3;
  sat_solver *s;
  Sto_Man_t *pCnf;
  int *piVar4;
  Kit_Graph_t *pGraph;
  Hop_Obj_t *pHVar5;
  ulong uVar6;
  uint uVar7;
  uint *puTruth;
  uint *local_30;
  
  s = Abc_MfsCreateSolverResub(p,pCands,nCands,0);
  iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar3 == -1) {
    pCnf = (Sto_Man_t *)sat_solver_store_release(s);
    sat_solver_delete(s);
    piVar4 = Int_ManSetGlobalVars(p->pMan,nCands);
    if (0 < nCands) {
      pVVar1 = p->vProjVarsCnf;
      pCVar2 = p->pCnf;
      uVar6 = 0;
      do {
        uVar7 = (pCands[uVar6] >> 1) + pCVar2->nVars * -2;
        if (((int)uVar7 < 0) || (pVVar1->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4[uVar6] = pVVar1->pArray[uVar7];
        uVar6 = uVar6 + 1;
      } while ((uint)nCands != uVar6);
    }
    iVar3 = Int_ManInterpolate(p->pMan,pCnf,0,&local_30);
    Sto_ManFree(pCnf);
    if (iVar3 != nCands) {
      __assert_fail("nFanins == nCands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsInter.c"
                    ,0x17f,"Hop_Obj_t *Abc_NtkMfsInterplate(Mfs_Man_t *, int *, int)");
    }
    pGraph = Kit_TruthToGraph(local_30,nCands,p->vMem);
    pHVar5 = Kit_GraphToHop((Hop_Man_t *)p->pNtk->pManFunc,pGraph);
    Kit_GraphFree(pGraph);
  }
  else {
    p->nTimeOuts = p->nTimeOuts + 1;
    pHVar5 = (Hop_Obj_t *)0x0;
  }
  return pHVar5;
}

Assistant:

Hop_Obj_t * Abc_NtkMfsInterplate( Mfs_Man_t * p, int * pCands, int nCands )
{
    extern Hop_Obj_t * Kit_GraphToHop( Hop_Man_t * pMan, Kit_Graph_t * pGraph );
    int fDumpFile = 0;
    char FileName[32];
    sat_solver * pSat;
    Sto_Man_t * pCnf = NULL;
    unsigned * puTruth;
    Kit_Graph_t * pGraph;
    Hop_Obj_t * pFunc;
    int nFanins, status;
    int c, i, * pGloVars;
//    abctime clk = Abc_Clock();
//    p->nDcMints += Abc_NtkMfsInterplateEval( p, pCands, nCands );

    // derive the SAT solver for interpolation
    pSat = Abc_MfsCreateSolverResub( p, pCands, nCands, 0 );

    // dump CNF file (remember to uncomment two-lit clases in clause_create_new() in 'satSolver.c')
    if ( fDumpFile )
    {
        static int Counter = 0;
        sprintf( FileName, "cnf\\pj1_if6_mfs%03d.cnf", Counter++ );
        Sat_SolverWriteDimacs( pSat, FileName, NULL, NULL, 1 );
    }

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( fDumpFile )
        printf( "File %s has UNSAT problem with %d conflicts.\n", FileName, (int)pSat->stats.conflicts );
    if ( status != l_False )
    {
        p->nTimeOuts++;
        return NULL;
    }
//printf( "%d\n", pSat->stats.conflicts );
//    ABC_PRT( "S", Abc_Clock() - clk );
    // get the learned clauses
    pCnf = (Sto_Man_t *)sat_solver_store_release( pSat );
    sat_solver_delete( pSat );

    // set the global variables
    pGloVars = Int_ManSetGlobalVars( p->pMan, nCands );
    for ( c = 0; c < nCands; c++ )
    {
        // get the variable number of this divisor
        i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
        // get the corresponding SAT variable
        pGloVars[c] = Vec_IntEntry( p->vProjVarsCnf, i );
    }

    // derive the interpolant
    nFanins = Int_ManInterpolate( p->pMan, pCnf, 0, &puTruth );
    Sto_ManFree( pCnf );
    assert( nFanins == nCands );

    // transform interpolant into AIG
    pGraph = Kit_TruthToGraph( puTruth, nFanins, p->vMem );
    pFunc = Kit_GraphToHop( (Hop_Man_t *)p->pNtk->pManFunc, pGraph );
    Kit_GraphFree( pGraph );
    return pFunc;
}